

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O1

string * __thiscall
roaring::Roaring64Map::toString_abi_cxx11_(string *__return_storage_ptr__,Roaring64Map *this)

{
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_38._8_8_ = 0;
  pcStack_20 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/cpp/roaring64map.hh:1419:21)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/cpp/roaring64map.hh:1419:21)>
             ::_M_manager;
  local_38._M_unused._M_object = __return_storage_ptr__;
  printToSink(this,(function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toString() const {
        std::string result;
        auto sink = [&result](const std::string &s) { result += s; };
        printToSink(sink);
        return result;
    }